

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O0

_Bool project(source origin,wchar_t rad,loc_conflict finish,wchar_t dam,wchar_t typ,wchar_t flg,
             wchar_t degrees_of_arc,uint8_t diameter_of_source,object *obj)

{
  wchar_t x_00;
  bool bVar1;
  chunk_conflict *pcVar2;
  _Bool _Var3;
  bool bVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  void *__ptr;
  square_conflict *psVar8;
  loc_conflict lVar9;
  loc grid2;
  monster *pmVar10;
  monster_conflict *mon_00;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  source origin_04;
  wchar_t local_1e84;
  int local_1e68;
  int local_1e64;
  monster *mon_2;
  wchar_t power;
  monster *mon_1;
  wchar_t y_2;
  wchar_t x_2;
  monster *mon;
  int iStack_1e08;
  loc_conflict last_hit_grid;
  wchar_t num_hit;
  _Bool did_hit;
  _Bool was_obvious;
  wchar_t tmp_d;
  loc_conflict tmp_1;
  wchar_t diff;
  wchar_t rotate;
  wchar_t tmp;
  wchar_t n2x;
  wchar_t n2y;
  loc_conflict adj_grid;
  _Bool can_see_one;
  _Bool on_path;
  loc_conflict grid;
  wchar_t x_1;
  wchar_t y_1;
  _Bool beam;
  _Bool seen;
  wchar_t nx;
  wchar_t ny;
  wchar_t ox;
  wchar_t oy;
  wchar_t x;
  wchar_t y;
  int *dam_at_dist;
  _Bool player_sees_grid [256];
  wchar_t distance_to_grid [256];
  loc_conflict blast_grid [256];
  wchar_t local_106c;
  wchar_t num_grids;
  loc_conflict path_grid [512];
  wchar_t num_path_grids;
  _Bool blind;
  _Bool drawing;
  int iStack_5c;
  _Bool notice;
  wchar_t n1x;
  wchar_t n1y;
  loc_conflict start;
  loc_conflict centre;
  uint32_t dam_temp;
  wchar_t dist_from_centre;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t rad_local;
  loc_conflict finish_local;
  source origin_local;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  iStack_5c = 0;
  num_path_grids = L'\0';
  path_grid[0x1ff].y._3_1_ = 0;
  path_grid[0x1ff].y._2_1_ = 0;
  path_grid[0x1ff].y._1_1_ = player->timed[2] != 0;
  path_grid[0x1ff].x = L'\0';
  local_106c = L'\0';
  __ptr = malloc((long)(int)(z_info->max_range + 1) << 2);
  handle_stuff(player);
  if ((flg & 1U) == 0) {
    origin_00._4_4_ = 0;
    _n1x = origin_get_loc(origin_00);
    if ((n1y == L'\xffffffff') && (n1x == L'\xffffffff')) {
      _n1x = finish;
    }
  }
  else {
    flg = flg & 0xfffffffe;
    _n1x = finish;
  }
  if ((((flg & 0x400U) != 0) && (degrees_of_arc == L'\0')) && (rad != L'\0')) {
    flg = flg & 0xfffffbffU | 6;
  }
  _Var3 = loc_eq((loc)_n1x,(loc)finish);
  if (_Var3) {
    player_sees_grid[0xf8] = false;
    player_sees_grid[0xf9] = false;
    player_sees_grid[0xfa] = false;
    player_sees_grid[0xfb] = false;
    distance_to_grid._1016_8_ = finish;
    psVar8 = square((chunk *)cave,finish);
    flag_on_dbg(psVar8->info,3,0x12,"square(cave, finish)->info","SQUARE_PROJECT");
    local_106c = L'\x01';
    start = finish;
  }
  else {
    oy = n1y;
    ox = n1x;
    path_grid[0x1ff].x =
         project_path((chunk *)cave,(loc_conflict *)&stack0xffffffffffffef98,(uint)z_info->max_range
                      ,_n1x,finish,flg);
    if ((((flg & 2U) != 0) && (L'\0' < rad)) && (rad < path_grid[0x1ff].x)) {
      path_grid[0x1ff].x = rad;
    }
    if ((flg & 0x400U) == 0) {
      for (k = L'\0'; k < path_grid[0x1ff].x; k = k + L'\x01') {
        wVar5 = path_grid[(long)k + -1].y;
        x_00 = *(wchar_t *)(&stack0xffffffffffffef98 + (long)k * 8);
        _Var3 = square_ispassable((chunk *)cave,
                                  *(loc_conflict *)(&stack0xffffffffffffef98 + (long)k * 8));
        pcVar2 = cave;
        if (((!_Var3) && (L'\0' < rad)) && ((flg & 2U) == 0)) break;
        if ((flg & 2U) == 0) {
          if (k == path_grid[0x1ff].x + L'\xffffffff') {
            blast_grid[(long)local_106c + -1].y = wVar5;
            blast_grid[(long)local_106c + -1].x = x_00;
            distance_to_grid[(long)local_106c + -2] = L'\0';
            lVar9 = (loc_conflict)loc(x_00,wVar5);
            psVar8 = square((chunk *)pcVar2,lVar9);
            flag_on_dbg(psVar8->info,3,0x12,"square(cave, loc(x, y))->info","SQUARE_PROJECT");
            local_106c = local_106c + L'\x01';
          }
        }
        else {
          blast_grid[(long)local_106c + -1].y = wVar5;
          blast_grid[(long)local_106c + -1].x = x_00;
          distance_to_grid[(long)local_106c + -2] = L'\0';
          lVar9 = (loc_conflict)loc(x_00,wVar5);
          psVar8 = square((chunk *)pcVar2,lVar9);
          flag_on_dbg(psVar8->info,3,0x12,"square(cave, loc(x, y))->info","SQUARE_PROJECT");
          local_106c = local_106c + L'\x01';
        }
        pcVar2 = cave;
        if (((path_grid[0x1ff].y._1_1_ & 1) == 0) && ((flg & 0x80U) == 0)) {
          lVar9 = (loc_conflict)loc(x_00,wVar5);
          _Var3 = square_isview((chunk *)pcVar2,lVar9);
          event_signal_bolt(EVENT_BOLT,typ,(_Bool)(path_grid[0x1ff].y._2_1_ & 1),_Var3,
                            (flg & 2U) != 0,oy,ox,wVar5,x_00);
        }
        ox = x_00;
        oy = wVar5;
      }
    }
    start.y = oy;
    start.x = ox;
  }
  typ_local = rad;
  if ((L'\0' < rad) && ((flg & 2U) == 0)) {
    if (((flg & 0x400U) != 0) && (path_grid[0x1ff].x != L'\0')) {
      start = _n1x;
      if (L'\x14' < rad) {
        typ_local = L'\x14';
      }
      if (path_grid[0x1ff].x < L'\x15') {
        k = path_grid[0x1ff].x + L'\xffffffff';
      }
      else {
        k = L'\x14';
      }
      iStack_5c = (path_grid[(long)k + -1].y - n1y) + 0x14;
      num_path_grids = (*(int *)(&stack0xffffffffffffef98 + (long)k * 8) - n1x) + L'\x14';
    }
    if (local_106c == L'\0') {
      distance_to_grid[0xfe] = start.x;
      distance_to_grid[0xff] = start.y;
      player_sees_grid[0xf8] = false;
      player_sees_grid[0xf9] = false;
      player_sees_grid[0xfa] = false;
      player_sees_grid[0xfb] = false;
      psVar8 = square((chunk *)cave,start);
      flag_on_dbg(psVar8->info,3,0x12,"square(cave, centre)->info","SQUARE_PROJECT");
      local_106c = L'\x01';
    }
    for (grid.y = start.y - typ_local; grid.y <= start.y + typ_local; grid.y = grid.y + L'\x01') {
      for (grid.x = start.x - typ_local; grid.x <= start.x + typ_local; grid.x = grid.x + L'\x01') {
        lVar9 = (loc_conflict)loc(grid.x,grid.y);
        bVar1 = false;
        _Var3 = loc_eq((loc)lVar9,(loc)start);
        if (!_Var3) {
          if (L'þ' < local_106c) break;
          _Var3 = square_in_bounds((chunk *)cave,lVar9);
          if (_Var3) {
            if (((flg & 4U) != 0) || (_Var3 = square_ispassable((chunk *)cave,lVar9), _Var3)) {
              _Var3 = square_isprojectable((chunk *)cave,lVar9);
              if (!_Var3) {
                bVar4 = false;
                for (k = L'\0'; k < L'\b'; k = k + L'\x01') {
                  grid2 = loc_sum((loc)lVar9,ddgrid_ddd[k]);
                  _Var3 = los(cave,(loc)start,grid2);
                  if (_Var3) {
                    bVar4 = true;
                    break;
                  }
                }
                goto joined_r0x00219387;
              }
            }
            else {
              bVar4 = square_isprojectable((chunk *)cave,lVar9);
joined_r0x00219387:
              if (!bVar4) goto LAB_0021962f;
            }
            wVar5 = distance((loc)start,(loc)lVar9);
            if (wVar5 <= typ_local) {
              for (k = L'\0'; k < path_grid[0x1ff].x; k = k + L'\x01') {
                _Var3 = loc_eq((loc)lVar9,*(loc *)(&stack0xffffffffffffef98 + (long)k * 8));
                if (_Var3) {
                  bVar1 = true;
                }
              }
              if ((flg & 0x400U) != 0) {
                iVar6 = (grid.y - n1y) + 0x14;
                iVar7 = (grid.x - n1x) + 0x14;
                local_1e64 = 0x5a - (uint)get_angle_to_grid[iStack_5c][num_path_grids];
                if ((int)((uint)get_angle_to_grid[iVar6][iVar7] + local_1e64) < 0) {
                  local_1e64 = -((uint)get_angle_to_grid[iVar6][iVar7] + local_1e64);
                }
                else {
                  local_1e64 = (uint)get_angle_to_grid[iVar6][iVar7] + local_1e64;
                }
                local_1e64 = local_1e64 % 0xb4;
                if (0x5a - local_1e64 < 0) {
                  local_1e68 = -(0x5a - local_1e64);
                }
                else {
                  local_1e68 = 0x5a - local_1e64;
                }
                if (((degrees_of_arc + L'\x06') / 4 <= local_1e68) && (!bVar1)) goto LAB_0021962f;
              }
              _Var3 = los(cave,(loc)start,(loc)lVar9);
              if ((_Var3) || (bVar1)) {
                blast_grid[(long)local_106c + -1].y = grid.y;
                blast_grid[(long)local_106c + -1].x = grid.x;
                distance_to_grid[(long)local_106c + -2] = wVar5;
                psVar8 = square((chunk *)cave,lVar9);
                flag_on_dbg(psVar8->info,3,0x12,"square(cave, grid)->info","SQUARE_PROJECT");
                local_106c = local_106c + L'\x01';
              }
            }
          }
        }
LAB_0021962f:
      }
    }
  }
  for (k = L'\0'; k <= (int)(uint)z_info->max_range; k = k + L'\x01') {
    if (typ_local < k) {
      centre.x = L'\0';
    }
    else if ((diameter_of_source == '\0') || (k == L'\0')) {
      centre.x = (dam + k) / (k + L'\x01');
    }
    else {
      centre.x = ((uint)diameter_of_source * dam) / (k + L'\x01');
      if ((uint)dam < (uint)centre.x) {
        centre.x = dam;
      }
    }
    *(wchar_t *)((long)__ptr + (long)k * 4) = centre.x;
  }
  dam_temp = 0;
  for (k = L'\0'; k <= typ_local; k = k + L'\x01') {
    for (dist_from_centre = dam_temp; dist_from_centre < local_106c;
        dist_from_centre = dist_from_centre + L'\x01') {
      if (distance_to_grid[(long)dist_from_centre + -2] == k) {
        wVar5 = distance_to_grid[(long)(int)dam_temp + -2];
        lVar9 = blast_grid[(long)(int)dam_temp + -1];
        blast_grid[(long)(int)dam_temp + -1] = blast_grid[(long)dist_from_centre + -1];
        distance_to_grid[(long)(int)dam_temp + -2] = distance_to_grid[(long)dist_from_centre + -2];
        blast_grid[(long)dist_from_centre + -1] = lVar9;
        distance_to_grid[(long)dist_from_centre + -2] = wVar5;
        dam_temp = dam_temp + 1;
      }
    }
  }
  for (k = L'\0'; k < local_106c; k = k + L'\x01') {
    _Var3 = panel_contains(blast_grid[(long)k + -1].y,blast_grid[(long)k + -1].x);
    if ((((_Var3) && (_Var3 = square_isview((chunk *)cave,blast_grid[(long)k + -1]), _Var3)) &&
        ((path_grid[0x1ff].y._1_1_ & 1) == 0)) && ((flg & 0x80U) == 0)) {
      player_sees_grid[(long)k + -8] = true;
    }
    else {
      player_sees_grid[(long)k + -8] = false;
    }
  }
  event_signal_blast(EVENT_EXPLOSION,typ,local_106c,(int *)(player_sees_grid + 0xf8),
                     (_Bool)(path_grid[0x1ff].y._2_1_ & 1),(_Bool *)&dam_at_dist,
                     (loc *)(distance_to_grid + 0xfe),(loc)start);
  if ((flg & 0x20U) != 0) {
    for (k = L'\0'; k < local_106c; k = k + L'\x01') {
      origin_01._4_4_ = 0;
      origin_01.what = origin_00.what;
      origin_01.which.trap = origin_00.which.trap;
      _Var3 = project_o(origin_01,distance_to_grid[(long)k + -2],blast_grid[(long)k + -1],
                        *(wchar_t *)((long)__ptr + (long)distance_to_grid[(long)k + -2] * 4),typ,obj
                       );
      if (_Var3) {
        path_grid[0x1ff].y._3_1_ = 1;
      }
    }
  }
  if ((flg & 0x40U) != 0) {
    last_hit_grid.y._3_1_ = 0;
    last_hit_grid.y._2_1_ = 0;
    last_hit_grid.x = L'\0';
    register0x00000000 = loc(0,0);
    for (k = L'\0'; pcVar2 = cave, k < local_106c; k = k + L'\x01') {
      _Var3 = square_isproject((chunk *)cave,blast_grid[(long)k + -1]);
      if ((_Var3) &&
         (pmVar10 = square_monster((chunk *)cave,blast_grid[(long)k + -1]),
         pmVar10 != (monster *)0x0)) {
        origin_02._4_4_ = 0;
        origin_02.what = origin_00.what;
        origin_02.which.trap = origin_00.which.trap;
        project_m(origin_02,distance_to_grid[(long)k + -2],(loc)blast_grid[(long)k + -1],
                  *(wchar_t *)((long)__ptr + (long)distance_to_grid[(long)k + -2] * 4),typ,flg,
                  (_Bool *)((long)&last_hit_grid.y + 2),(_Bool *)((long)&last_hit_grid.y + 3));
        if ((last_hit_grid.y._3_1_ & 1) != 0) {
          path_grid[0x1ff].y._3_1_ = 1;
        }
        if ((last_hit_grid.y._2_1_ & 1) != 0) {
          last_hit_grid.x = last_hit_grid.x + L'\x01';
          unique0x00012000 = pmVar10->grid;
        }
      }
    }
    if (((origin_00.what == SRC_PLAYER) && (last_hit_grid.x == L'\x01')) && ((flg & 1U) == 0)) {
      lVar9 = (loc_conflict)loc(mon._4_4_,iStack_1e08);
      psVar8 = square((chunk *)pcVar2,lVar9);
      pcVar2 = cave;
      if (0 < psVar8->mon) {
        lVar9 = (loc_conflict)loc(mon._4_4_,iStack_1e08);
        pmVar10 = square_monster((chunk *)pcVar2,lVar9);
        _Var3 = monster_is_visible(pmVar10);
        if (_Var3) {
          monster_race_track(player->upkeep,pmVar10->race);
          health_track(player->upkeep,pmVar10);
        }
      }
    }
  }
  if ((flg & 0x800U) != 0) {
    mon_2._4_4_ = L'\0';
    if (origin_00.what == SRC_MONSTER) {
      origin_local.what = origin.which._0_4_;
      mon_00 = cave_monster(cave,origin_local.what);
      local_1e84 = mon_00->race->spell_power;
      _Var3 = monster_is_powerful((monster *)mon_00);
      mon_2._4_4_ = local_1e84;
      if (_Var3) {
        if (local_1e84 < L'P') {
          local_1e84 = L'P';
        }
        mon_2._4_4_ = local_1e84;
      }
    }
    for (k = L'\0'; k < local_106c; k = k + L'\x01') {
      origin_03._4_4_ = 0;
      origin_03.what = origin_00.what;
      origin_03.which.trap = origin_00.which.trap;
      _Var3 = project_p(origin_03,distance_to_grid[(long)k + -2],blast_grid[(long)k + -1],
                        *(wchar_t *)((long)__ptr + (long)distance_to_grid[(long)k + -2] * 4),typ,
                        mon_2._4_4_,(flg & 0x4000U) != 0);
      if (_Var3) {
        path_grid[0x1ff].y._3_1_ = 1;
        if ((player->is_dead & 1U) != 0) {
          free(__ptr);
          goto LAB_00219ddc;
        }
        break;
      }
    }
  }
  if ((flg & 0x10U) != 0) {
    for (k = L'\0'; k < local_106c; k = k + L'\x01') {
      origin_04._4_4_ = 0;
      origin_04.what = origin_00.what;
      origin_04.which.trap = origin_00.which.trap;
      _Var3 = project_f(origin_04,distance_to_grid[(long)k + -2],blast_grid[(long)k + -1],
                        *(wchar_t *)((long)__ptr + (long)distance_to_grid[(long)k + -2] * 4),typ);
      if (_Var3) {
        path_grid[0x1ff].y._3_1_ = 1;
      }
    }
  }
  for (k = L'\0'; k < local_106c; k = k + L'\x01') {
    psVar8 = square((chunk *)cave,blast_grid[(long)k + -1]);
    flag_off(psVar8->info,3,0x12);
  }
  if (player->upkeep->update != 0) {
    update_stuff(player);
  }
  free(__ptr);
LAB_00219ddc:
  origin_local.which.grid.y._3_1_ = path_grid[0x1ff].y._3_1_ & 1;
  return (_Bool)origin_local.which.grid.y._3_1_;
}

Assistant:

bool project(struct source origin, int rad, struct loc finish,
			 int dam, int typ, int flg,
			 int degrees_of_arc, uint8_t diameter_of_source,
			 const struct object *obj)
{
	int i, j, k, dist_from_centre;

	uint32_t dam_temp;

	struct loc centre;
	struct loc start;

	int n1y = 0;
	int n1x = 0;

	/* Assume the player sees nothing */
	bool notice = false;

	/* Notify the UI if it can draw this projection */
	bool drawing = false;

	/* Is the player blind? */
	bool blind = (player->timed[TMD_BLIND] ? true : false);

	/* Number of grids in the "path" */
	int num_path_grids = 0;

	/* Actual grids in the "path" */
	struct loc path_grid[512];

	/* Number of grids in the "blast area" (including the "beam" path) */
	int num_grids = 0;

	/* Coordinates of the affected grids */
	struct loc blast_grid[256];

	/* Distance to each of the affected grids. */
	int distance_to_grid[256];

	/* Player visibility of each of the affected grids. */
	bool player_sees_grid[256];

	/* Precalculated damage values for each distance. */
	int *dam_at_dist = malloc((z_info->max_range + 1) * sizeof(*dam_at_dist));

	/* Flush any pending output */
	handle_stuff(player);

	/* No projection path - jump to target */
	if (flg & PROJECT_JUMP) {
		start = finish;

		/* Clear the flag */
		flg &= ~(PROJECT_JUMP);
	} else {
		start = origin_get_loc(origin);

		/* Default to finish grid */
		if (start.y == -1 && start.x == -1) {
			start = finish;
		}
	}

	/* Default center of explosion (if any) */
	centre = start;

	/*
	 * An arc spell with no width and a non-zero radius is actually a
	 * beam of defined length.  Mark it as such.
	 */
	if ((flg & (PROJECT_ARC)) && (degrees_of_arc == 0) && (rad != 0)) {
		/* No longer an arc */
		flg &= ~(PROJECT_ARC);

		/* Now considered a beam */
		flg |= (PROJECT_BEAM);
		flg |= (PROJECT_THRU);
	}

	/*
	 * If a single grid is both start and finish (for example
	 * if PROJECT_JUMP is set), store it; otherwise, travel along the
	 * projection path.
	 */
	if (loc_eq(start, finish)) {
		blast_grid[num_grids] =  finish;
		centre = finish;
		distance_to_grid[num_grids] = 0;
		sqinfo_on(square(cave, finish)->info, SQUARE_PROJECT);
		num_grids++;
	} else {
		/* Start from caster */
		int y = start.y;
		int x = start.x;

		/* Calculate the projection path */
		num_path_grids = project_path(cave, path_grid, z_info->max_range, start,
									  finish, flg);

		/* Some beams have limited length. */
		if (flg & (PROJECT_BEAM)) {
			/* Use length limit, if any is given. */
			if ((rad > 0) && (rad < num_path_grids)) {
				num_path_grids = rad;
			}
		}


		/* Project along the path (except for arcs) */
		if (!(flg & (PROJECT_ARC))) {
			for (i = 0; i < num_path_grids; ++i) {
				int oy = y;
				int ox = x;

				int ny = path_grid[i].y;
				int nx = path_grid[i].x;

				/* Hack -- Balls explode before reaching walls. */
				if (!square_ispassable(cave, path_grid[i]) && (rad > 0) &&
					!(flg & (PROJECT_BEAM)))
					break;

				/* Advance */
				y = ny;
				x = nx;

				/* Beams collect all grids in the path, all other methods
				 * collect only the final grid in the path. */
				if (flg & (PROJECT_BEAM)) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				} else if (i == num_path_grids - 1) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				}

				/* Only do visuals if requested and within range limit. */
				if (!blind && !(flg & (PROJECT_HIDE))) {
					bool seen = square_isview(cave, loc(x, y));
					bool beam = flg & (PROJECT_BEAM);

					/* Tell the UI to display the bolt */
					event_signal_bolt(EVENT_BOLT, typ, drawing, seen, beam, oy,
									  ox, y, x);
				}
			}
		}

		/* Save the "blast epicenter" */
		centre.y = y;
		centre.x = x;
	}

	/* Now check for explosions.  Beams have already stored all the grids they
	 * will affect; all non-beam projections with positive radius explode in
	 * some way */
	if ((rad > 0) && (!(flg & (PROJECT_BEAM)))) {
		int y, x;

		/* Pre-calculate some things for arcs. */
		if ((flg & (PROJECT_ARC)) && (num_path_grids != 0)) {
			/* Explosion centers on the caster. */
			centre = start;

			/* The radius of arcs cannot be more than 20 */
			if (rad > 20)
				rad = 20;

			/* Ensure legal access into get_angle_to_grid table */
			if (num_path_grids < 21)
				i = num_path_grids - 1;
			else
				i = 20;

			/* Reorient the grid forming the end of the arc's centerline. */
			n1y = path_grid[i].y - centre.y + 20;
			n1x = path_grid[i].x - centre.x + 20;
		}

		/* If the explosion centre hasn't been saved already, save it now. */
		if (num_grids == 0) {
			blast_grid[num_grids] = centre;
			distance_to_grid[num_grids] = 0;
			sqinfo_on(square(cave, centre)->info, SQUARE_PROJECT);
			num_grids++;
		}

		/* Scan every grid that might possibly be in the blast radius. */
		for (y = centre.y - rad; y <= centre.y + rad; y++) {
			for (x = centre.x - rad; x <= centre.x + rad; x++) {
				struct loc grid = loc(x, y);
				bool on_path = false;

				/* Center grid has already been stored. */
				if (loc_eq(grid, centre))
					continue;

				/* Precaution: Stay within area limit. */
				if (num_grids >= 255)
					break;

				/* Ignore "illegal" locations */
				if (!square_in_bounds(cave, grid))
					continue;

				/* Most explosions are immediately stopped by walls. If
				 * PROJECT_THRU is set, walls can be affected if adjacent to
				 * a grid visible from the explosion centre - note that as of
				 * Angband 3.5.0 there are no such explosions - NRM.
				 * All explosions can affect one layer of terrain which is
				 * passable but not projectable */
				if ((flg & (PROJECT_THRU)) || square_ispassable(cave, grid)) {
					/* If this is a wall grid, ... */
					if (!square_isprojectable(cave, grid)) {
						bool can_see_one = false;
						/* Check neighbors */
						for (i = 0; i < 8; i++) {
							struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);
							if (los(cave, centre, adj_grid)) {
								can_see_one = true;
								break;
							}
						}

						/* Require at least one adjacent grid in LOS. */
						if (!can_see_one)
							continue;
					}
				} else if (!square_isprojectable(cave, grid))
					continue;

				/* Must be within maximum distance. */
				dist_from_centre  = (distance(centre, grid));
				if (dist_from_centre > rad)
					continue;

				/* Mark grids which are on the projection path */
				for (i = 0; i < num_path_grids; i++) {
					if (loc_eq(grid, path_grid[i])) {
						on_path = true;
					}
				}

				/* Do we need to consider a restricted angle? */
				if (flg & (PROJECT_ARC)) {
					/* Use angle comparison to delineate an arc. */
					int n2y, n2x, tmp, rotate, diff;

					/* Reorient current grid for table access. */
					n2y = y - start.y + 20;
					n2x = x - start.x + 20;

					/* Find the angular difference (/2) between the lines to
					 * the end of the arc's center-line and to the current grid.
					 */
					rotate = 90 - get_angle_to_grid[n1y][n1x];
					tmp = ABS(get_angle_to_grid[n2y][n2x] + rotate) % 180;
					diff = ABS(90 - tmp);

					/* If difference is greater then that allowed, skip it,
					 * unless it's on the target path */
					if ((diff >= (degrees_of_arc + 6) / 4) && !on_path)
						continue;
				}

				/* Accept remaining grids if in LOS or on the projection path */
				if (los(cave, centre, grid) || on_path) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = dist_from_centre;
					sqinfo_on(square(cave, grid)->info, SQUARE_PROJECT);
					num_grids++;
				}
			}
		}
	}

	/* Calculate and store the actual damage at each distance. */
	for (i = 0; i <= z_info->max_range; i++) {
		if (i > rad) {
			/* No damage outside the radius. */
			dam_temp = 0;
		} else if ((!diameter_of_source) || (i == 0)) {
			/* Standard damage calc. for 10' source diameters, or at origin. */
			dam_temp = (dam + i) / (i + 1);
		} else {
			/* If a particular diameter for the source of the explosion's
			 * energy is given, it is full strength to that diameter and
			 * then reduces */
			dam_temp = (diameter_of_source * dam) / (i + 1);
			if (dam_temp > (uint32_t) dam) {
				dam_temp = dam;
			}
		}

		/* Store it. */
		dam_at_dist[i] = dam_temp;
	}


	/* Sort the blast grids by distance from the centre. */
	for (i = 0, k = 0; i <= rad; i++) {
		/* Collect all the grids of a given distance together. */
		for (j = k; j < num_grids; j++) {
			if (distance_to_grid[j] == i) {
				struct loc tmp;
				int tmp_d = distance_to_grid[k];
				tmp = blast_grid[k];

				blast_grid[k] = blast_grid[j];
				distance_to_grid[k] = distance_to_grid[j];

				blast_grid[j] = tmp;
				distance_to_grid[j] = tmp_d;

				/* Write to next slot */
				k++;
			}
		}
	}

	/* Establish which grids are visible - no blast visuals with PROJECT_HIDE */
	for (i = 0; i < num_grids; i++) {
		if (panel_contains(blast_grid[i].y, blast_grid[i].x) &&
			square_isview(cave, blast_grid[i]) &&
			!blind && !(flg & (PROJECT_HIDE))) {
			player_sees_grid[i] = true;
		} else {
			player_sees_grid[i] = false;
		}
	}

	/* Tell the UI to display the blast */
	event_signal_blast(EVENT_EXPLOSION, typ, num_grids, distance_to_grid,
					   drawing, player_sees_grid, blast_grid, centre);

	/* Affect objects on every relevant grid */
	if (flg & (PROJECT_ITEM)) {
		for (i = 0; i < num_grids; i++) {
			if (project_o(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, obj)) {
				notice = true;
			}
		}
	}

	/* Check monsters */
	if (flg & (PROJECT_KILL)) {
		bool was_obvious = false;
		bool did_hit = false;
		int num_hit = 0;
		struct loc last_hit_grid = loc(0, 0);

		/* Scan for monsters */
		for (i = 0; i < num_grids; i++) {
			struct monster *mon = NULL;

			/* Check this monster hasn't been processed already */
			if (!square_isproject(cave, blast_grid[i]))
				continue;

			/* Check there is actually a monster here */
			mon = square_monster(cave, blast_grid[i]);
			if (mon == NULL)
				continue;

			/* Affect the monster in the grid */
			project_m(origin, distance_to_grid[i], blast_grid[i],
			          dam_at_dist[distance_to_grid[i]], typ, flg,
			          &did_hit, &was_obvious);
			if (was_obvious) {
				notice = true;
			}
			if (did_hit) {
				num_hit++;

				/* Monster location may have been updated by project_m() */
				last_hit_grid = mon->grid;
			}
		}

		/* Player affected one monster (without "jumping") */
		if (origin.what == SRC_PLAYER &&
				num_hit == 1 &&
				!(flg & PROJECT_JUMP)) {
			/* Location */
			int x = last_hit_grid.x;
			int y = last_hit_grid.y;

			/* Track if possible */
			if (square(cave, loc(x, y))->mon > 0) {
				struct monster *mon = square_monster(cave, loc(x, y));

				/* Recall and track */
				if (monster_is_visible(mon)) {
					monster_race_track(player->upkeep, mon->race);
					health_track(player->upkeep, mon);
				}
			}
		}
	}

	/* Look for the player, affect them when found */
	if (flg & (PROJECT_PLAY)) {
		/* Set power */
		int power = 0;
		if (origin.what == SRC_MONSTER) {
			struct monster *mon = cave_monster(cave, origin.which.monster);
			power = mon->race->spell_power;

			/* Breaths from powerful monsters get power effects as well */
			if (monster_is_powerful(mon))
				power = MAX(power, 80);
		}
		for (i = 0; i < num_grids; i++) {
			if (project_p(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, power,
						  flg & PROJECT_SELF)) {
				notice = true;
				if (player->is_dead) {
					free(dam_at_dist);
					return notice;
				}
				break;
			}
		}
	}

	/* Affect features in every relevant grid */
	if (flg & (PROJECT_GRID)) {
		for (i = 0; i < num_grids; i++) {
			if (project_f(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ)) {
				notice = true;
			}
		}
	}

	/* Clear all the processing marks. */
	for (i = 0; i < num_grids; i++) {
		/* Clear the mark */
		sqinfo_off(square(cave, blast_grid[i])->info, SQUARE_PROJECT);
	}

	/* Update stuff if needed */
	if (player->upkeep->update) update_stuff(player);

	free(dam_at_dist);

	/* Return "something was noticed" */
	return (notice);
}